

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_armor.cpp
# Opt level: O3

void __thiscall ABasicArmorBonus::Serialize(ABasicArmorBonus *this,FSerializer *arc)

{
  BYTE *pBVar1;
  int iVar2;
  undefined4 extraout_var;
  FSerializer *pFVar4;
  double *pdVar5;
  double *pdVar6;
  PClass *pPVar3;
  
  AInventory::Serialize((AInventory *)this,arc);
  pPVar3 = (this->super_AArmor).super_AInventory.super_AActor.super_DThinker.super_DObject.Class;
  if (pPVar3 == (PClass *)0x0) {
    iVar2 = (**(this->super_AArmor).super_AInventory.super_AActor.super_DThinker.super_DObject.
               _vptr_DObject)(this);
    pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
    (this->super_AArmor).super_AInventory.super_AActor.super_DThinker.super_DObject.Class = pPVar3;
  }
  pBVar1 = pPVar3->Defaults;
  pdVar6 = (double *)0x0;
  pdVar5 = (double *)(pBVar1 + 0x500);
  if (save_full != false) {
    pdVar5 = pdVar6;
  }
  pFVar4 = ::Serialize(arc,"savepercent",&this->SavePercent,pdVar5);
  pdVar5 = (double *)(pBVar1 + 0x514);
  if (save_full != false) {
    pdVar5 = pdVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"saveamount",&this->SaveAmount,(int32_t *)pdVar5);
  pdVar5 = (double *)(pBVar1 + 0x508);
  if (save_full != false) {
    pdVar5 = pdVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"maxsaveamount",&this->MaxSaveAmount,(int32_t *)pdVar5);
  pdVar5 = (double *)(pBVar1 + 0x518);
  if (save_full != false) {
    pdVar5 = pdVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"bonuscount",&this->BonusCount,(int32_t *)pdVar5);
  pdVar5 = (double *)(pBVar1 + 0x51c);
  if (save_full != false) {
    pdVar5 = pdVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"bonusmax",&this->BonusMax,(int32_t *)pdVar5);
  pdVar5 = (double *)(pBVar1 + 0x50c);
  if (save_full != false) {
    pdVar5 = pdVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"maxabsorb",&this->MaxAbsorb,(int32_t *)pdVar5);
  pdVar5 = (double *)(pBVar1 + 0x510);
  if (save_full != false) {
    pdVar5 = pdVar6;
  }
  ::Serialize(pFVar4,"maxfullabsorb",&this->MaxFullAbsorb,(int32_t *)pdVar5);
  return;
}

Assistant:

void ABasicArmorBonus::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	auto def = (ABasicArmorBonus *)GetDefault();
	arc("savepercent", SavePercent, def->SavePercent)
		("saveamount", SaveAmount, def->SaveAmount)
		("maxsaveamount", MaxSaveAmount, def->MaxSaveAmount)
		("bonuscount", BonusCount, def->BonusCount)
		("bonusmax", BonusMax, def->BonusMax)
		("maxabsorb", MaxAbsorb, def->MaxAbsorb)
		("maxfullabsorb", MaxFullAbsorb, def->MaxFullAbsorb);
}